

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

size_t __thiscall CDBWrapper::DynamicMemoryUsage(CDBWrapper *this)

{
  string_view str;
  string_view logging_function;
  bool bVar1;
  uint uVar2;
  LevelDBContext *pLVar3;
  unsigned_long *puVar4;
  char *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var5;
  optional<unsigned_long> oVar6;
  optional<unsigned_long> parsed;
  string memory;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  Slice *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  byte local_d2;
  DB *pDVar7;
  int source_line;
  undefined1 in_stack_ffffffffffffff58 [16];
  unsigned_long local_80;
  ConstevalFormatString<0U> in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffb0;
  _Storage<unsigned_long,_true> in_stack_ffffffffffffffb8;
  undefined1 local_28 [32];
  long local_8;
  
  source_line = in_stack_ffffffffffffff58._4_4_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_ffffffffffffff00);
  std::optional<unsigned_long>::optional
            ((optional<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pLVar3 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pDVar7 = pLVar3->pdb;
  leveldb::Slice::Slice(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  uVar2 = (*pDVar7->_vptr_DB[9])(pDVar7,&stack0xffffffffffffffa8,local_28);
  local_d2 = 1;
  if ((uVar2 & 1) != 0) {
    _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff08);
    source_line = _Var5._M_len._4_4_;
    str._M_str = in_RDI;
    str._M_len = (size_t)pDVar7;
    oVar6 = ToIntegral<unsigned_long>(str);
    in_stack_ffffffffffffffb8._M_value =
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_long> *)
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    local_d2 = bVar1 ^ 0xff;
  }
  if ((local_d2 & 1) == 0) {
    puVar4 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffffef8);
    local_80 = *puVar4;
  }
  else {
    bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),Trace)
    ;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff08,
                 (char *)in_stack_ffffffffffffff00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff08,
                 (char *)in_stack_ffffffffffffff00);
      in_stack_fffffffffffffee8 = 1;
      logging_function._M_str = (char *)in_stack_ffffffffffffffb8._M_value;
      logging_function._M_len = in_stack_ffffffffffffffb0;
      LogPrintFormatInternal<>
                (logging_function,in_stack_ffffffffffffffa0,source_line,0x1cef6a7,(Level)this,
                 in_stack_ffffffffffffff98);
    }
    local_80 = 0;
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_80;
}

Assistant:

size_t CDBWrapper::DynamicMemoryUsage() const
{
    std::string memory;
    std::optional<size_t> parsed;
    if (!DBContext().pdb->GetProperty("leveldb.approximate-memory-usage", &memory) || !(parsed = ToIntegral<size_t>(memory))) {
        LogDebug(BCLog::LEVELDB, "Failed to get approximate-memory-usage property\n");
        return 0;
    }
    return parsed.value();
}